

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiTabBar *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImU32 col;
  uint uVar8;
  size_t __nmemb;
  ImDrawList *this;
  undefined1 local_48 [8];
  int local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  bVar2 = pIVar3->SkipItems;
  if (bVar2 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(0);
    }
    pIVar4 = (GImGui->TabBars).Buf.Data;
    local_48._0_4_ = 0.0;
    local_48._4_4_ = 0.0;
    local_40 = (int)((ulong)((long)tab_bar - (long)pIVar4) >> 7);
    if (tab_bar < pIVar4 || pIVar4 + (GImGui->TabBars).Buf.Size <= tab_bar) {
      local_48 = (undefined1  [8])tab_bar;
      local_40 = -1;
    }
    ImVector<ImGuiPtrOrIndex>::push_back(&pIVar6->CurrentTabBarStack,(ImGuiPtrOrIndex *)local_48);
    pIVar6->CurrentTabBar = tab_bar;
    iVar7 = tab_bar->CurrFrameVisible;
    if (iVar7 != pIVar6->FrameCount) {
      if (((((flags & 1U) != 0) && ((tab_bar->Flags & 1) == 0)) &&
          (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) &&
         (tab_bar->PrevFrameVisible != -1)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x28,TabItemComparerByVisibleOffset);
        iVar7 = tab_bar->CurrFrameVisible;
      }
      uVar8 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar8 = flags;
      }
      tab_bar->Flags = uVar8;
      IVar5 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar5;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = iVar7;
      tab_bar->CurrFrameVisible = pIVar6->FrameCount;
      IVar5 = (pIVar6->Style).FramePadding;
      tab_bar->FramePadding = IVar5;
      local_48._4_4_ = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
      local_48._0_4_ = tab_bar->OffsetMaxIdeal;
      ItemSize((ImVec2 *)local_48,IVar5.y);
      (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      col = GetColorU32((uint)((uVar8 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      local_38.y = (tab_bar->BarRect).Max.y + -1.0;
      if (dock_node == (ImGuiDockNode *)0x0) {
        local_38.x = (float)(int)((pIVar3->WindowPadding).x * 0.5);
        local_48._0_4_ = (tab_bar->BarRect).Min.x - local_38.x;
        local_38.x = (tab_bar->BarRect).Max.x + local_38.x;
        this = pIVar3->DrawList;
      }
      else {
        fVar1 = (dock_node->Pos).x;
        local_48._0_4_ = fVar1 + pIVar3->WindowBorderSize;
        local_38.x = (fVar1 + (dock_node->Size).x) - pIVar3->WindowBorderSize;
        this = pIVar3->DrawList;
      }
      local_48._4_4_ = local_38.y;
      ImDrawList::AddLine(this,(ImVec2 *)local_48,&local_38,col,1.0);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        //IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}